

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int64_t __thiscall llvm::APInt::srem(APInt *this,int64_t RHS)

{
  bool bVar1;
  uint64_t uVar2;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  APInt local_30;
  uint64_t local_20;
  int64_t RHS_local;
  APInt *this_local;
  
  local_20 = RHS;
  RHS_local = (int64_t)this;
  bVar1 = isNegative(this);
  if (bVar1) {
    if ((long)local_20 < 0) {
      APInt(&local_40,this);
      llvm::operator-((llvm *)&local_30,&local_40);
      uVar2 = urem(&local_30,-local_20);
      this_local = (APInt *)-uVar2;
      ~APInt(&local_30);
      ~APInt(&local_40);
    }
    else {
      APInt(&local_60,this);
      llvm::operator-((llvm *)&local_50,&local_60);
      uVar2 = urem(&local_50,local_20);
      this_local = (APInt *)-uVar2;
      ~APInt(&local_50);
      ~APInt(&local_60);
    }
  }
  else if ((long)local_20 < 0) {
    this_local = (APInt *)urem(this,-local_20);
  }
  else {
    this_local = (APInt *)urem(this,local_20);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t APInt::srem(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return -((-(*this)).urem(-RHS));
    return -((-(*this)).urem(RHS));
  }
  if (RHS < 0)
    return this->urem(-RHS);
  return this->urem(RHS);
}